

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool get_phys_addr_aarch64
                (CPUARMState_conflict *env,target_ulong address,MMUAccessType access_type,
                ARMMMUIdx mmu_idx,hwaddr *phys_ptr,MemTxAttrs *attrs,int *prot,
                target_ulong *page_size,ARMMMUFaultInfo_conflict1 *fi,ARMCacheAttrs *cacheattrs)

{
  CPUState *cs;
  ARMCacheAttrs AVar1;
  uc_struct_conflict2 *puVar2;
  long lVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint8_t uVar6;
  byte bVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  ARMCacheAttrs AVar14;
  ARMMMUIdx AVar15;
  uint uVar16;
  int iVar17;
  uint32_t uVar18;
  uint64_t uVar19;
  ARMCacheAttrs *cacheattrs_00;
  target_ulong tVar20;
  ulong uVar21;
  ARMMMUIdx AVar22;
  int ap;
  int iVar23;
  ulong uVar24;
  ARMMMUIdx AVar25;
  ARMMMUIdx mmu_idx_00;
  CPUARMState_conflict *__mptr;
  ulong uVar26;
  uint uVar27;
  ARMMMUIdx AVar28;
  ARMFaultType AVar29;
  hwaddr hVar30;
  bool bVar31;
  uint local_ac;
  uint8_t local_a8;
  ARMMMUIdx local_64;
  hwaddr ipa;
  ulong local_50;
  ulong local_48;
  ARMCPU_conflict1 *local_40;
  ARMCacheAttrs cacheattrs2;
  int s2_prot;
  
  puVar2 = env->uc;
  if ((mmu_idx < ARMMMUIdx_E2) && ((0xd0000U >> (mmu_idx & 0x1f) & 1) != 0)) {
    if ((env->features & 0x100000000) != 0) {
      cacheattrs2 = (ARMCacheAttrs)0x0;
      if (mmu_idx == ARMMMUIdx_E10_0) {
        mmu_idx = ARMMMUIdx_Stage1_E0;
      }
      else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
        mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
      }
      else if (mmu_idx == ARMMMUIdx_E10_1) {
        mmu_idx = ARMMMUIdx_Stage1_E1;
      }
      _Var4 = get_phys_addr_aarch64
                        (env,address,access_type,mmu_idx,&ipa,attrs,prot,page_size,fi,cacheattrs);
      if ((!_Var4) && (_Var5 = regime_translation_disabled(env,ARMMMUIdx_Stage2), !_Var5)) {
        cacheattrs_00 = &cacheattrs2;
        if (cacheattrs == (ARMCacheAttrs *)0x0) {
          cacheattrs_00 = (ARMCacheAttrs *)0x0;
        }
        _Var4 = get_phys_addr_lpae(env,CONCAT44(ipa._4_4_,(uint)ipa),access_type,ARMMMUIdx_Stage2,
                                   phys_ptr,attrs,&s2_prot,page_size,fi,cacheattrs_00);
        AVar14 = cacheattrs2;
        fi->s2addr = CONCAT44(ipa._4_4_,(uint)ipa);
        *prot = *prot & s2_prot;
        if (cacheattrs != (ARMCacheAttrs *)0x0 && !_Var4) {
          if (((env->cp15).hcr_el2 & 0x1000) != 0) {
            *(ushort *)cacheattrs = SUB42(*cacheattrs,0) & 0xfc00 | 0xff;
          }
          AVar1 = *cacheattrs;
          uVar9 = (uint)AVar1 & 0xff;
          uVar8 = extract32(uVar9,0,4);
          uVar10 = (uint)AVar14 & 0xff;
          uVar18 = extract32(uVar10,0,4);
          uVar12 = extract32(uVar9,4,4);
          uVar13 = extract32(uVar10,4,4);
          uVar10 = (uint)AVar1 >> 8 & 3;
          uVar9 = 0x200;
          if ((uVar10 != 2) && (uVar11 = (uint)AVar14 >> 8 & 3, uVar11 != 2)) {
            uVar9 = 0;
            if (uVar11 == 3) {
              uVar9 = 0x300;
            }
            if (uVar10 == 3) {
              uVar9 = 0x300;
            }
          }
          if (((uint8_t)uVar12 == '\0') || ((uVar13 & 0xff) == 0)) {
            AVar14 = (ARMCacheAttrs)0x200;
            uVar9 = uVar8 & 0xff;
            if ((uVar9 != 0) &&
               (((uVar10 = uVar18 & 0xff, AVar14 = (ARMCacheAttrs)0x200, uVar10 != 0 &&
                 (AVar14 = (ARMCacheAttrs)0x204, uVar9 != 4)) && (uVar10 != 4)))) {
              AVar14 = (ARMCacheAttrs)((uint)(uVar10 != 8 && uVar9 != 8) * 4 + 0x208);
            }
          }
          else {
            uVar6 = combine_cacheattr_nibble((uint8_t)uVar12,(uint8_t)uVar13);
            local_a8 = (uint8_t)uVar18;
            bVar7 = combine_cacheattr_nibble((uint8_t)uVar8,local_a8);
            bVar7 = bVar7 | uVar6 << 4;
            AVar14 = (ARMCacheAttrs)0x244;
            if (bVar7 != 0x44) {
              AVar14 = (ARMCacheAttrs)(uVar9 | bVar7);
            }
          }
          *cacheattrs = AVar14;
          return false;
        }
        return _Var4;
      }
      *phys_ptr = CONCAT44(ipa._4_4_,(uint)ipa);
      return _Var4;
    }
    if (mmu_idx == ARMMMUIdx_E10_0) {
      mmu_idx = ARMMMUIdx_Stage1_E0;
    }
    else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
      mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
    }
    else if (mmu_idx == ARMMMUIdx_E10_1) {
      mmu_idx = ARMMMUIdx_Stage1_E1;
    }
  }
  tVar20 = address;
  _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,(ARMMMUIdx)address);
  *attrs = (MemTxAttrs)(((uint)*attrs & 0xfffffffd) + (uint)_Var4 * 2);
  AVar15 = (ARMMMUIdx)tVar20;
  _Var4 = regime_is_user((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
  *attrs = (MemTxAttrs)(((uint)*attrs & 0xfffffffb) + (uint)_Var4 * 4);
  if ((mmu_idx != ARMMMUIdx_Stage2 && address < 0x2000000) && ((env->features & 0x8000000) == 0)) {
    AVar15 = mmu_idx;
    uVar8 = regime_el(env,mmu_idx);
    address = address + (&(env->cp15).field_38.fcseidr_ns)[uVar8 == 3];
  }
  AVar25 = (ARMMMUIdx)address;
  if ((env->features & 0x80) == 0) {
    _Var4 = regime_translation_disabled(env,mmu_idx);
    if (_Var4) {
      if (mmu_idx != ARMMMUIdx_Stage2) {
        uVar8 = regime_el(env,mmu_idx);
        _Var4 = arm_el_is_aa64(env,uVar8);
        if (_Var4) {
          uVar9 = arm_pamax((ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14));
          uVar19 = (env->cp15).tcr_el[uVar8].raw_tcr;
          uVar10 = aa64_va_parameter_tbi(uVar19,mmu_idx);
          if (access_type == MMU_INST_FETCH) {
            uVar11 = aa64_va_parameter_tbid(uVar19,mmu_idx);
            uVar10 = uVar10 & ~uVar11;
          }
          uVar19 = extract64(address,0x37,1);
          uVar19 = extract64(address,uVar9,
                             ((uint)((uVar10 >> ((uint)uVar19 & 0x1f) & 1) == 0) * 8 - uVar9) + 0x38
                            );
          if (uVar19 != 0) {
            fi->type = ARMFault_AddressSize;
            fi->level = 0;
            fi->stage2 = false;
            return true;
          }
          address = extract64(address,0,0x34);
        }
      }
      *phys_ptr = address;
      *prot = 7;
      *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
      return false;
    }
    _Var4 = regime_using_lpae_format(env,mmu_idx);
    if (_Var4) {
      _Var4 = get_phys_addr_lpae(env,address,access_type,mmu_idx,phys_ptr,attrs,prot,page_size,fi,
                                 cacheattrs);
      return _Var4;
    }
    uVar19 = regime_sctlr(env,mmu_idx);
    cs = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
    if (((uint)uVar19 >> 0x17 & 1) != 0) {
      AVar29 = ARMFault_Translation;
      AVar15 = mmu_idx;
      _Var4 = get_level1_table_address(env,mmu_idx,(uint32_t *)&ipa,AVar25);
      if (_Var4) {
        _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
        uVar8 = arm_ldl_ptw(cs,(ulong)(uint)ipa,_Var4,mmu_idx,fi);
        if (fi->type != ARMFault_None) {
          uVar9 = 0;
          iVar23 = 1;
          goto LAB_005aade9;
        }
        iVar23 = 1;
        uVar10 = uVar8 & 3;
        if (uVar10 == 0) {
          uVar9 = 0;
        }
        else {
          if ((uVar10 != 3) || ((env->features & 0x2000000) != 0)) {
            uVar9 = uVar8 >> 5 & 0xf;
            local_48 = CONCAT44(local_48._4_4_,uVar8);
            uVar11 = 0;
            if ((uVar8 >> 0x12 & 1) == 0) {
              uVar11 = uVar9;
            }
            if (uVar10 == 1) {
              uVar11 = uVar9;
            }
            uVar24 = (ulong)uVar11;
            uVar8 = regime_el(env,mmu_idx);
            uVar16 = *(uint32_t *)
                      ((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar8 != 1) * 2 + 2) * 4);
            iVar23 = (uVar10 == 1) + 1;
            if ((uVar16 >> uVar11 * 2 & 1) == 0) {
              AVar29 = ARMFault_Domain;
              uVar9 = uVar11;
              goto LAB_005aade3;
            }
            AVar15 = (ARMMMUIdx)local_48;
            local_50 = uVar24;
            if (uVar10 == 1) {
              local_64 = 0;
              if (((uint)env->features >> 0x19 & 1) != 0) {
                local_64 = (ARMMMUIdx)local_48 >> 2 & 1;
              }
              AVar28 = 3;
              uVar8 = extract32((ARMMMUIdx)local_48,3,1);
              local_40 = (ARMCPU_conflict1 *)CONCAT44(local_40._4_4_,uVar8);
              _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,AVar28);
              AVar15 = arm_ldl_ptw(cs,(ulong)((ARMMMUIdx)(address >> 10) & 0x3fc |
                                             AVar15 & 0xfffffc00),_Var4,mmu_idx,fi);
              if (fi->type != ARMFault_None) {
                iVar23 = 2;
                goto LAB_005aade9;
              }
              uVar10 = AVar15 >> 7 & 4 | AVar15 >> 4 & 3;
              if ((AVar15 & 3) - 2 < 2) {
                AVar28 = AVar15 & 0xfffff000;
                AVar25 = AVar25 & 0xfff | AVar28;
                AVar15 = AVar15 & 1;
                *page_size = 0x1000;
              }
              else {
                if ((AVar15 & 3) == 0) {
                  iVar23 = 2;
                  goto LAB_005aaddf;
                }
                AVar28 = AVar15 & 0xffff0000;
                AVar25 = AVar25 & 0xffff | AVar28;
                AVar15 = AVar15 & 0x8000;
                *page_size = 0x10000;
              }
              hVar30 = (hwaddr)AVar25;
              uVar8 = (uint32_t)local_40;
            }
            else {
              if (((ARMMMUIdx)local_48 >> 0x12 & 1) == 0) {
                hVar30 = (hwaddr)(AVar25 & 0xfffff | (ARMMMUIdx)local_48 & 0xfff00000);
                tVar20 = 0x100000;
              }
              else {
                AVar15 = (ARMMMUIdx)local_48 & 0xff000000;
                uVar8 = extract32((ARMMMUIdx)local_48,0x14,4);
                uVar18 = extract32((ARMMMUIdx)local_48,5,4);
                hVar30 = (ulong)uVar18 << 0x24 | CONCAT44(uVar8,AVar25 & 0xffffff | AVar15);
                tVar20 = 0x1000000;
              }
              *page_size = tVar20;
              uVar10 = (ARMMMUIdx)local_48 >> 0xd & 4 | (ARMMMUIdx)local_48 >> 10 & 3;
              AVar15 = (ARMMMUIdx)local_48 & ARMMMUIdx_E10_0;
              local_64 = (ARMMMUIdx)local_48 & 1;
              AVar28 = ARMMMUIdx_E10_1_PAN;
              uVar8 = extract32((ARMMMUIdx)local_48,0x13,1);
            }
            uVar9 = uVar16 >> (sbyte)(uVar11 * 2) & 3;
            if (uVar9 == 3) {
              *prot = 7;
              local_40._0_4_ = uVar8;
              goto LAB_005ab267;
            }
            local_40 = (ARMCPU_conflict1 *)CONCAT44(local_40._4_4_,uVar8);
            if (local_64 != 0) {
              _Var4 = regime_is_user((CPUARMState_conflict *)(ulong)mmu_idx,AVar28);
              if (!_Var4) {
                AVar15 = 1;
              }
            }
            AVar29 = ARMFault_Permission;
            if ((access_type == MMU_INST_FETCH) && (AVar15 != 0)) {
LAB_005ab1f7:
              uVar9 = (uint)local_50;
            }
            else {
              if (((env->features & 0x10) == 0) ||
                 (uVar19 = regime_sctlr(env,mmu_idx), ((uint)uVar19 >> 0x1d & 1) == 0)) {
                uVar9 = ap_to_rw_prot(env,mmu_idx,uVar10,uVar9);
              }
              else {
                if ((uVar10 & 1) == 0) {
                  AVar29 = ARMFault_AccessFlag;
                  goto LAB_005ab1f7;
                }
                uVar9 = simple_ap_to_rw_prot((CPUARMState_conflict *)(ulong)mmu_idx,uVar10 >> 1,ap);
              }
              uVar10 = uVar9 | 4;
              if (uVar9 == 0) {
                uVar10 = uVar9;
              }
              if (AVar15 != 0) {
                uVar10 = uVar9;
              }
              *prot = uVar10;
              uVar9 = (uint)local_50;
              if ((uVar10 >> (access_type & 0x1f) & 1) != 0) {
LAB_005ab267:
                if ((uint32_t)local_40 != 0) {
                  *(byte *)attrs = *(byte *)attrs & 0xfd;
                }
                *phys_ptr = hVar30;
                return false;
              }
            }
            goto LAB_005aade3;
          }
          uVar9 = 0;
        }
LAB_005aaddf:
        AVar29 = ARMFault_Translation;
      }
      else {
        iVar23 = 1;
        uVar9 = 0;
      }
LAB_005aade3:
      fi->type = AVar29;
LAB_005aade9:
      fi->domain = uVar9;
      fi->level = iVar23;
      return true;
    }
    AVar15 = mmu_idx;
    _Var4 = get_level1_table_address(env,mmu_idx,(uint32_t *)&ipa,AVar25);
    AVar29 = ARMFault_Translation;
    if (_Var4) {
      _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
      AVar15 = arm_ldl_ptw(cs,(ulong)(uint)ipa,_Var4,mmu_idx,fi);
      if (fi->type != ARMFault_None) {
        uVar9 = 0;
        iVar23 = 1;
        goto LAB_005aabc2;
      }
      uVar9 = AVar15 >> 5 & 0xf;
      uVar8 = regime_el(env,mmu_idx);
      uVar10 = *(uint32_t *)((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar8 != 1) * 2 + 2) * 4) >>
               (char)uVar9 * '\x02';
      AVar28 = AVar15 & 3;
      if (AVar28 == 0) {
        iVar23 = 1;
switchD_005ab124_caseD_0:
      }
      else {
        if (AVar28 == 2) {
          iVar23 = 1;
          if ((uVar10 & 1) == 0) {
            AVar29 = ARMFault_Domain;
            goto LAB_005aabbf;
          }
LAB_005aaefa:
          AVar25 = AVar25 & 0xfffff | AVar15 & 0xfff00000;
          uVar11 = AVar15 >> 10;
          *page_size = 0x100000;
        }
        else {
          if ((uVar10 & 1) == 0) {
            iVar23 = 2;
            AVar29 = ARMFault_Domain;
            goto switchD_005ab124_caseD_0;
          }
          if (AVar28 == 2) {
            iVar23 = 2;
            goto LAB_005aaefa;
          }
          bVar31 = AVar28 == 1;
          AVar22 = 0xfffff000;
          if (bVar31) {
            AVar22 = 0xfffffc00;
          }
          mmu_idx_00 = 0xffc;
          if (bVar31) {
            mmu_idx_00 = 0x3fc;
          }
          _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,mmu_idx_00);
          AVar15 = arm_ldl_ptw(cs,(ulong)(AVar25 >> (bVar31 * '\x02' | 8U) & mmu_idx_00 |
                                         AVar22 & AVar15),_Var4,mmu_idx,fi);
          if (fi->type != ARMFault_None) {
            iVar23 = 2;
            goto LAB_005aabc2;
          }
          iVar23 = 2;
          switch(AVar15 & 3) {
          case 0:
            goto switchD_005ab124_caseD_0;
          case 1:
            bVar7 = (byte)(AVar25 >> 0xd);
            AVar25 = AVar25 & 0xffff | AVar15 & 0xffff0000;
            *page_size = 0x10000;
            break;
          case 2:
            bVar7 = (byte)(AVar25 >> 9);
            AVar25 = AVar25 & 0xfff | AVar15 & 0xfffff000;
            *page_size = 0x1000;
            break;
          case 3:
            if (AVar28 == 1) {
              if ((env->features & 10) == 0) goto switchD_005ab124_caseD_0;
              tVar20 = 0x1000;
              AVar28 = 0xfff;
              AVar22 = 0xfffff000;
            }
            else {
              tVar20 = 0x400;
              AVar28 = 0x3ff;
              AVar22 = 0xfffffc00;
            }
            AVar25 = AVar28 & AVar25 | AVar22 & AVar15;
            *page_size = tVar20;
            uVar11 = AVar15 >> 4;
            goto LAB_005aaf1a;
          }
          uVar11 = AVar15 >> (bVar7 & 6) + 4;
        }
LAB_005aaf1a:
        iVar17 = ap_to_rw_prot(env,mmu_idx,uVar11 & 3,uVar10 & 3);
        uVar10 = iVar17 + (uint)(iVar17 != 0) * 4;
        *prot = uVar10;
        if ((uVar10 >> (access_type & 0x1f) & 1) != 0) {
          *phys_ptr = (ulong)AVar25;
          return false;
        }
        AVar29 = ARMFault_Permission;
      }
    }
    else {
      uVar9 = 0;
      iVar23 = 1;
    }
LAB_005aabbf:
    fi->type = AVar29;
LAB_005aabc2:
    fi->domain = uVar9;
    fi->level = iVar23;
    return true;
  }
  *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
  if (((uint)env->features >> 0x1b & 1) != 0) {
    puVar2 = env->uc;
    _Var4 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
    if (((env->features & 0x2000000000) != 0) && (!_Var4)) {
      fi->type = ARMFault_QEMU_SFault;
      *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
      *phys_ptr = address & 0xffffffff;
      *prot = 0;
      return true;
    }
    _Var4 = pmsav8_mpu_lookup_aarch64
                      (env,AVar25,access_type,mmu_idx,phys_ptr,(MemTxAttrs *)prot,prot,(_Bool *)&ipa
                       ,fi,(uint32_t *)0x0);
    if ((char)ipa == '\0') {
      tVar20 = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
    }
    else {
      tVar20 = 1;
    }
    *page_size = tVar20;
    return _Var4;
  }
  if ((env->features & 0x20) == 0) {
    _Var4 = regime_is_user((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
    _Var5 = regime_translation_disabled(env,mmu_idx);
    *phys_ptr = address & 0xffffffff;
    if (_Var5) {
      *prot = 7;
      return false;
    }
    uVar9 = 7;
    bVar7 = 0x1c;
    while( true ) {
      if ((int)uVar9 < 0) {
        fi->type = ARMFault_Background;
        return true;
      }
      AVar15 = (env->cp15).c6_region[uVar9];
      if (((AVar15 & 1) != 0) &&
         (((AVar15 ^ AVar25) >> ((byte)AVar15 >> 1 & 0x1f) & 0xfffffffe) == 0)) break;
      uVar9 = uVar9 - 1;
      bVar7 = bVar7 - 4;
    }
    iVar23 = 7;
    switch((env->cp15).c6_region[(ulong)(access_type == MMU_INST_FETCH) - 0x12] >> (bVar7 & 0x1f) &
           0xf) {
    case 1:
      if (!_Var4) break;
    default:
switchD_005aac25_caseD_0:
      fi->type = ARMFault_Permission;
      fi->level = 1;
      return true;
    case 2:
      iVar23 = (uint)!_Var4 * 2 + 5;
      break;
    case 3:
      break;
    case 5:
      if (_Var4) goto switchD_005aac25_caseD_0;
    case 6:
      iVar23 = 5;
    }
    *prot = iVar23;
    return false;
  }
  puVar2 = env->uc;
  _Var4 = regime_is_user((CPUARMState_conflict *)(ulong)mmu_idx,AVar15);
  local_50 = CONCAT71(local_50._1_7_,_Var4);
  local_48 = address & 0xffffffff;
  *phys_ptr = local_48;
  *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
  *prot = 0;
  _Var4 = regime_translation_disabled(env,mmu_idx);
  if ((_Var4) || (_Var4 = m_is_ppb_region(env,AVar25), _Var4)) {
LAB_005aa76c:
    get_phys_addr_pmsav7_default(env,mmu_idx,AVar25,prot);
  }
  else {
    local_40 = (ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14);
    uVar24 = (ulong)*(uint *)((long)env[1].xregs + 0x1c);
    do {
      while( true ) {
        do {
          do {
            uVar21 = uVar24;
            uVar24 = uVar21 - 1;
            if ((int)uVar21 < 1) goto LAB_005aab40;
            uVar26 = uVar24 & 0xffffffff;
            AVar15 = (env->pmsav7).drbar[uVar26];
            uVar8 = extract32((env->pmsav7).drsr[uVar26],1,5);
            uVar9 = (env->pmsav7).drsr[uVar26];
          } while (((uVar9 & 1) == 0) || (uVar8 == 0));
          uVar10 = uVar8 + 1;
          AVar28 = ~(uint)(-1L << ((byte)uVar10 & 0x3f));
        } while ((AVar15 & AVar28) != 0);
        if ((AVar15 <= AVar25) && (AVar25 <= AVar15 + AVar28)) break;
        lVar3 = puVar2->init_target_page->mask;
        uVar21 = (ulong)((uint)lVar3 & (ARMMMUIdx)local_48);
        if ((uVar21 <= ((ulong)AVar28 + (ulong)AVar15) - 1) &&
           ((ulong)AVar15 <= ((lVar3 * -0x100000000 >> 0x20) + uVar21) - 1)) {
          *page_size = 1;
        }
      }
      local_ac = uVar10;
      if (uVar8 < 7) break;
      uVar27 = uVar8 - 2;
      uVar16 = AVar25 - AVar15 >> ((byte)uVar27 & 0x1f) & 7;
      uVar8 = extract32(uVar9,uVar16 + 8,1);
      uVar9 = 2;
      for (uVar11 = (uint)(uVar8 != 0) * 3;
          ((local_ac = uVar10, uVar9 < 9 &&
           (local_ac = uVar27, uVar27 < (uint)puVar2->init_target_page->bits)) &&
          (uVar18 = extract32((env->pmsav7).drsr[uVar26],-uVar9 & uVar16 | 8,uVar9),
          uVar11 == uVar18)); uVar11 = uVar11 | uVar11 << (bVar7 & 0x1f)) {
        bVar7 = (byte)uVar9;
        uVar27 = uVar27 + 1;
        uVar9 = uVar9 * 2;
      }
    } while (uVar8 != 0);
    if (local_ac < (uint)puVar2->init_target_page->bits) {
      *page_size = 1L << ((byte)local_ac & 0x3f);
    }
LAB_005aab40:
    if (uVar21 == 0) {
      _Var4 = pmsav7_use_background_region(local_40,mmu_idx,(_Bool)(char)local_50);
      if (!_Var4) {
        fi->type = ARMFault_Background;
        return true;
      }
      goto LAB_005aa76c;
    }
    uVar8 = extract32((env->pmsav7).dracr[(int)uVar24],8,3);
    uVar18 = extract32((env->pmsav7).dracr[(int)uVar24],0xc,1);
    _Var4 = m_is_system_region(env,AVar25);
    if ((char)local_50 == '\0') {
      if (uVar8 - 1 < 3) goto switchD_005aabb7_caseD_3;
      if (uVar8 - 5 < 2) goto switchD_005aabb7_caseD_2;
      if (uVar8 == 7) goto switchD_005aabb7_caseD_7;
    }
    else {
      switch(uVar8) {
      case 3:
switchD_005aabb7_caseD_3:
        *(byte *)prot = (byte)*prot | 2;
      case 2:
      case 6:
switchD_005aabb7_caseD_2:
        *(byte *)prot = (byte)*prot | 5;
        break;
      case 7:
switchD_005aabb7_caseD_7:
        if ((env->features & 0x200) != 0) goto switchD_005aabb7_caseD_2;
      }
    }
    if (_Var4 || uVar18 != 0) {
      *(byte *)prot = (byte)*prot & 0xfb;
    }
  }
  fi->type = ARMFault_Permission;
  fi->level = 1;
  return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
}

Assistant:

bool get_phys_addr(CPUARMState *env, target_ulong address,
                   MMUAccessType access_type, ARMMMUIdx mmu_idx,
                   hwaddr *phys_ptr, MemTxAttrs *attrs, int *prot,
                   target_ulong *page_size,
                   ARMMMUFaultInfo *fi, ARMCacheAttrs *cacheattrs)
{
    struct uc_struct *uc = env->uc;
    if (mmu_idx == ARMMMUIdx_E10_0 ||
        mmu_idx == ARMMMUIdx_E10_1 ||
        mmu_idx == ARMMMUIdx_E10_1_PAN) {
        /* Call ourselves recursively to do the stage 1 and then stage 2
         * translations.
         */
        if (arm_feature(env, ARM_FEATURE_EL2)) {
            hwaddr ipa;
            int s2_prot;
            int ret;
            ARMCacheAttrs cacheattrs2 = { 0 };

            ret = get_phys_addr(env, address, access_type,
                                stage_1_mmu_idx(mmu_idx), &ipa, attrs,
                                prot, page_size, fi, cacheattrs);

            /* If S1 fails or S2 is disabled, return early.  */
            if (ret || regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
                *phys_ptr = ipa;
                return ret;
            }

            /* S1 is done. Now do S2 translation.  */
            ret = get_phys_addr_lpae(env, ipa, access_type, ARMMMUIdx_Stage2,
                                     phys_ptr, attrs, &s2_prot,
                                     page_size, fi,
                                     cacheattrs != NULL ? &cacheattrs2 : NULL);
            fi->s2addr = ipa;
            /* Combine the S1 and S2 perms.  */
            *prot &= s2_prot;

            /* Combine the S1 and S2 cache attributes, if needed */
            if (!ret && cacheattrs != NULL) {
                if (env->cp15.hcr_el2 & HCR_DC) {
                    /*
                     * HCR.DC forces the first stage attributes to
                     *  Normal Non-Shareable,
                     *  Inner Write-Back Read-Allocate Write-Allocate,
                     *  Outer Write-Back Read-Allocate Write-Allocate.
                     */
                    cacheattrs->attrs = 0xff;
                    cacheattrs->shareability = 0;
                }
                *cacheattrs = combine_cacheattrs(*cacheattrs, cacheattrs2);
            }

            return ret;
        } else {
            /*
             * For non-EL2 CPUs a stage1+stage2 translation is just stage 1.
             */
            mmu_idx = stage_1_mmu_idx(mmu_idx);
        }
    }

    /* The page table entries may downgrade secure to non-secure, but
     * cannot upgrade an non-secure translation regime's attributes
     * to secure.
     */
    attrs->secure = regime_is_secure(env, mmu_idx);
    attrs->user = regime_is_user(env, mmu_idx);

    /* Fast Context Switch Extension. This doesn't exist at all in v8.
     * In v7 and earlier it affects all stage 1 translations.
     */
    if (address < 0x02000000 && mmu_idx != ARMMMUIdx_Stage2
        && !arm_feature(env, ARM_FEATURE_V8)) {
        if (regime_el(env, mmu_idx) == 3) {
            address += env->cp15.fcseidr_s;
        } else {
            address += env->cp15.fcseidr_ns;
        }
    }

    if (arm_feature(env, ARM_FEATURE_PMSA)) {
        bool ret;
        *page_size = TARGET_PAGE_SIZE;

        if (arm_feature(env, ARM_FEATURE_V8)) {
            /* PMSAv8 */
            ret = get_phys_addr_pmsav8(env, address, access_type, mmu_idx,
                                       phys_ptr, attrs, prot, page_size, fi);
        } else if (arm_feature(env, ARM_FEATURE_V7)) {
            /* PMSAv7 */
            ret = get_phys_addr_pmsav7(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, page_size, fi);
        } else {
            /* Pre-v7 MPU */
            ret = get_phys_addr_pmsav5(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, fi);
        }
        qemu_log_mask(CPU_LOG_MMU, "PMSA MPU lookup for %s at 0x%08" PRIx32
                      " mmu_idx %u -> %s (prot %c%c%c)\n",
                      access_type == MMU_DATA_LOAD ? "reading" :
                      (access_type == MMU_DATA_STORE ? "writing" : "execute"),
                      (uint32_t)address, mmu_idx,
                      ret ? "Miss" : "Hit",
                      *prot & PAGE_READ ? 'r' : '-',
                      *prot & PAGE_WRITE ? 'w' : '-',
                      *prot & PAGE_EXEC ? 'x' : '-');

        return ret;
    }

    /* Definitely a real MMU, not an MPU */

    if (regime_translation_disabled(env, mmu_idx)) {
        /*
         * MMU disabled.  S1 addresses within aa64 translation regimes are
         * still checked for bounds -- see AArch64.TranslateAddressS1Off.
         */
        if (mmu_idx != ARMMMUIdx_Stage2) {
            int r_el = regime_el(env, mmu_idx);
            if (arm_el_is_aa64(env, r_el)) {
                int pamax = arm_pamax(env_archcpu(env));
                uint64_t tcr = env->cp15.tcr_el[r_el].raw_tcr;
                int addrtop, tbi;

                tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
                if (access_type == MMU_INST_FETCH) {
                    tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
                }
                tbi = (tbi >> extract64(address, 55, 1)) & 1;
                addrtop = (tbi ? 55 : 63);

                if (extract64(address, pamax, addrtop - pamax + 1) != 0) {
                    fi->type = ARMFault_AddressSize;
                    fi->level = 0;
                    fi->stage2 = false;
                    return 1;
                }

                /*
                 * When TBI is disabled, we've just validated that all of the
                 * bits above PAMax are zero, so logically we only need to
                 * clear the top byte for TBI.  But it's clearer to follow
                 * the pseudocode set of addrdesc.paddress.
                 */
                address = extract64(address, 0, 52);
            }
        }
        *phys_ptr = address;
        *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        *page_size = TARGET_PAGE_SIZE;
        return 0;
    }

    if (regime_using_lpae_format(env, mmu_idx)) {
        return get_phys_addr_lpae(env, address, access_type, mmu_idx,
                                  phys_ptr, attrs, prot, page_size,
                                  fi, cacheattrs);
    } else if (regime_sctlr(env, mmu_idx) & SCTLR_XP) {
        return get_phys_addr_v6(env, address, access_type, mmu_idx,
                                phys_ptr, attrs, prot, page_size, fi);
    } else {
        return get_phys_addr_v5(env, address, access_type, mmu_idx,
                                    phys_ptr, prot, page_size, fi);
    }
}